

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::cpp::GetBootstrapBasename
          (cpp *this,Options *options,string_view basename,string *bootstrap_basename)

{
  bool bVar1;
  int iVar2;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  *this_00;
  long lVar3;
  allocator<char> local_112;
  allocator_type local_111;
  string_view basename_local;
  const_iterator iter;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  
  basename_local._M_str = (char *)basename._M_len;
  if (this[0xca] == (cpp)0x0) {
    basename_local._M_len = (size_t)options;
    if (GetBootstrapBasename(google::protobuf::compiler::cpp::Options_const&,std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string*)
        ::bootstrap_mapping_abi_cxx11_ == '\0') {
      iVar2 = __cxa_guard_acquire(&GetBootstrapBasename(google::protobuf::compiler::cpp::Options_const&,std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string*)
                                   ::bootstrap_mapping_abi_cxx11_);
      if (iVar2 != 0) {
        this_00 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                   *)operator_new(0x20);
        std::
        pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[28],_const_char_(&)[32],_true>
                  (&local_f0,(char (*) [28])"net/proto2/proto/descriptor",
                   (char (*) [32])"third_party/protobuf/descriptor");
        std::
        pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[34],_const_char_(&)[34],_true>
                  (&local_c0,(char (*) [34])"third_party/protobuf/cpp_features",
                   (char (*) [34])"third_party/protobuf/cpp_features");
        std::
        pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[37],_const_char_(&)[37],_true>
                  (&local_90,(char (*) [37])"third_party/protobuf/compiler/plugin",
                   (char (*) [37])"third_party/protobuf/compiler/plugin");
        std::
        pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[34],_const_char_(&)[44],_true>
                  (&local_60,(char (*) [34])"net/proto2/compiler/proto/profile",
                   (char (*) [44])"net/proto2/compiler/proto/profile_bootstrap");
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
        ::
        raw_hash_set<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>const*>
                  (this_00,&local_f0,
                   (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&stack0xffffffffffffffd0,0,(hasher *)&iter,(key_equal *)&local_112,&local_111)
        ;
        lVar3 = 0xa0;
        do {
          std::__cxx11::string::~string((string *)((long)&local_f0.first._M_len + lVar3));
          lVar3 = lVar3 + -0x30;
        } while (lVar3 != -0x20);
        GetBootstrapBasename(google::protobuf::compiler::cpp::Options_const&,std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string*)
        ::bootstrap_mapping_abi_cxx11_ =
             (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)this_00;
        __cxa_guard_release(&GetBootstrapBasename(google::protobuf::compiler::cpp::Options_const&,std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string*)
                             ::bootstrap_mapping_abi_cxx11_);
      }
    }
    iter.inner_ = absl::lts_20250127::container_internal::
                  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                  ::find<std::basic_string_view<char,std::char_traits<char>>>
                            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                              *)GetBootstrapBasename(google::protobuf::compiler::cpp::Options_const&,std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string*)
                                ::bootstrap_mapping_abi_cxx11_,&basename_local);
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::AssertNotDebugCapacity
              ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)GetBootstrapBasename(google::protobuf::compiler::cpp::Options_const&,std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string*)
                  ::bootstrap_mapping_abi_cxx11_);
    local_f0.first._M_len = 0;
    bVar1 = absl::lts_20250127::container_internal::operator==(&iter.inner_,(iterator *)&local_f0);
    if (bVar1) {
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&local_f0,&basename_local,&local_112);
      std::__cxx11::string::operator=((string *)basename._M_str,(string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
    }
    else {
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::iterator::operator->(&iter.inner_);
      std::__cxx11::string::_M_assign((string *)basename._M_str);
    }
    bVar1 = !bVar1;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool GetBootstrapBasename(const Options& options, absl::string_view basename,
                          std::string* bootstrap_basename) {
  if (options.opensource_runtime) {
    return false;
  }

  static const auto* bootstrap_mapping =
      // TODO Replace these with string_view once we remove
      // StringPiece.
      new absl::flat_hash_map<absl::string_view, std::string>{
          {"net/proto2/proto/descriptor",
           "third_party/protobuf/descriptor"},
          {"third_party/protobuf/cpp_features",
           "third_party/protobuf/cpp_features"},
          {"third_party/protobuf/compiler/plugin",
           "third_party/protobuf/compiler/plugin"},
          {"net/proto2/compiler/proto/profile",
           "net/proto2/compiler/proto/profile_bootstrap"},
      };
  auto iter = bootstrap_mapping->find(basename);
  if (iter == bootstrap_mapping->end()) {
    *bootstrap_basename = std::string(basename);
    return false;
  } else {
    *bootstrap_basename = iter->second;
    return true;
  }
}